

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.cpp
# Opt level: O0

void * HokuyoThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_type sVar4;
  double local_8818;
  interval local_8810;
  char local_87f8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_85f0;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  double distances [2048];
  double angles [2048];
  timeval tv;
  HOKUYO hokuyo;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 100;
  local_85f0 = 0;
  hokuyo.d_max_err = (double)pParam;
  memset(&tv.tv_usec,0,0x578);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      if (bPauseHokuyo == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("Hokuyo paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectHokuyo((HOKUYO *)&tv.tv_usec);
      }
      if (bExit != 0) goto LAB_001d5e7b;
      mSleep(100);
    }
    if (bRestartHokuyo != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a Hokuyo.\n");
        chrono_period._68_4_ = 0;
        DisconnectHokuyo((HOKUYO *)&tv.tv_usec);
      }
      bRestartHokuyo = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectHokuyo((HOKUYO *)&tv.tv_usec,"Hokuyo0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = hokuyo.BaudRate;
        memset(angles + 0x7ff,0,0x10);
        memset(distances + 0x7ff,0,0x4000);
        memset(&stack0xffffffffffff7a68,0,0x4000);
        if (hokuyo._800_8_ != 0) {
          fclose((FILE *)hokuyo._800_8_);
          hokuyo.StepCount = 0;
          hokuyo._804_4_ = 0;
        }
        if ((hokuyo.timeout != 0) && (hokuyo._800_8_ == 0)) {
          sVar2 = strlen((char *)&hokuyo.pfSaveFile);
          if (sVar2 == 0) {
            sprintf(local_87f8,"hokuyo");
          }
          else {
            sprintf(local_87f8,"%.127s",&hokuyo.pfSaveFile);
          }
          sVar2 = strlen(local_87f8);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_87f8[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_87f8), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_87f8);
            memset(local_87f8 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.csv",local_87f8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          hokuyo._800_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)hokuyo._800_8_ == (FILE *)0x0) {
            printf("Unable to create Hokuyo data file.\n");
            goto LAB_001d5e7b;
          }
          fprintf((FILE *)hokuyo._800_8_,
                  "tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);...\n");
          fflush((FILE *)hokuyo._800_8_);
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetLatestDataHokuyo((HOKUYO *)&tv.tv_usec,(double *)&stack0xffffffffffff7a68,
                                  distances + 0x7ff);
      if (iVar1 == 0) {
        iVar1 = gettimeofday((timeval *)(angles + 0x7ff),(__timezone_ptr_t)0x0);
        if (iVar1 != 0) {
          angles[0x7ff] = 0.0;
          tv.tv_sec = 0;
        }
        EnterCriticalSection(&StateVariablesCS);
        szSaveFilePath[0xfc] = '\0';
        szSaveFilePath[0xfd] = '\0';
        szSaveFilePath[0xfe] = '\0';
        szSaveFilePath[0xff] = '\0';
        for (; (int)szSaveFilePath._252_4_ < hokuyo.StepAngleSize._0_4_;
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + 1) {
          alpha_mes_hokuyo = distances[(long)(int)szSaveFilePath._252_4_ + 0x7ff];
          d_mes_hokuyo = *(double *)
                          (&stack0xffffffffffff7a68 + (long)(int)szSaveFilePath._252_4_ * 8);
          std::vector<interval,_std::allocator<interval>_>::clear(&d_all_mes_hokuyo);
          interval::interval(&local_8810,&d_mes_hokuyo);
          std::vector<interval,_std::allocator<interval>_>::push_back(&d_all_mes_hokuyo,&local_8810)
          ;
          std::deque<double,_std::allocator<double>_>::push_back
                    (&alpha_mes_hokuyo_vector,&alpha_mes_hokuyo);
          std::deque<double,_std::allocator<double>_>::push_back(&d_mes_hokuyo_vector,&d_mes_hokuyo)
          ;
          std::
          deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
          ::push_back(&d_all_mes_hokuyo_vector,&d_all_mes_hokuyo);
          local_8818 = (double)tv.tv_sec * 1e-06 + (double)(long)angles[0x7ff];
          std::deque<double,_std::allocator<double>_>::push_back
                    (&t_hokuyo_history_vector,&local_8818);
          std::deque<interval,_std::allocator<interval>_>::push_back
                    (&xhat_hokuyo_history_vector,(value_type *)&xhat);
          std::deque<interval,_std::allocator<interval>_>::push_back
                    (&yhat_hokuyo_history_vector,(value_type *)&yhat);
          std::deque<interval,_std::allocator<interval>_>::push_back
                    (&psihat_hokuyo_history_vector,(value_type *)&psihat);
          std::deque<interval,_std::allocator<interval>_>::push_back
                    (&vrxhat_hokuyo_history_vector,(value_type *)&vrxhat);
          sVar4 = std::deque<double,_std::allocator<double>_>::size(&alpha_mes_hokuyo_vector);
          if (hokuyo.StepAngleSize._0_4_ < (int)sVar4) {
            std::deque<double,_std::allocator<double>_>::pop_front(&alpha_mes_hokuyo_vector);
            std::deque<double,_std::allocator<double>_>::pop_front(&d_mes_hokuyo_vector);
            std::
            deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
            ::pop_front(&d_all_mes_hokuyo_vector);
            std::deque<double,_std::allocator<double>_>::pop_front(&t_hokuyo_history_vector);
            std::deque<interval,_std::allocator<interval>_>::pop_front(&xhat_hokuyo_history_vector);
            std::deque<interval,_std::allocator<interval>_>::pop_front(&yhat_hokuyo_history_vector);
            std::deque<interval,_std::allocator<interval>_>::pop_front
                      (&psihat_hokuyo_history_vector);
            std::deque<interval,_std::allocator<interval>_>::pop_front
                      (&vrxhat_hokuyo_history_vector);
          }
        }
        LeaveCriticalSection(&StateVariablesCS);
        if (hokuyo.timeout != 0) {
          fprintf((FILE *)hokuyo._800_8_,"%d;%d;",(ulong)angles[0x7ff] & 0xffffffff,
                  tv.tv_sec & 0xffffffff);
          szSaveFilePath[0xfc] = '\0';
          szSaveFilePath[0xfd] = '\0';
          szSaveFilePath[0xfe] = '\0';
          szSaveFilePath[0xff] = '\0';
          for (; (int)szSaveFilePath._252_4_ < hokuyo.StepAngleSize._0_4_;
              szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + 1) {
            fprintf((FILE *)hokuyo._800_8_,"%.3f;%.3f;",
                    distances[(long)(int)szSaveFilePath._252_4_ + 0x7ff],
                    *(undefined8 *)
                     (&stack0xffffffffffff7a68 + (long)(int)szSaveFilePath._252_4_ * 8));
          }
          fprintf((FILE *)hokuyo._800_8_,"\n");
          fflush((FILE *)hokuyo._800_8_);
        }
      }
      else {
        printf("Connection to a Hokuyo lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectHokuyo((HOKUYO *)&tv.tv_usec);
        mSleep((long)i);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_85f0 = local_85f0 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_85f0)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001d5e7b:
      StopChronoQuick((CHRONO *)&errcount);
      if (hokuyo._800_8_ != 0) {
        fclose((FILE *)hokuyo._800_8_);
        hokuyo.StepCount = 0;
        hokuyo._804_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectHokuyo((HOKUYO *)&tv.tv_usec);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE HokuyoThread(void* pParam)
{
	HOKUYO hokuyo;
	//HOKUYODATA hokuyodata;
	struct timeval tv;
	double angles[MAX_SLITDIVISION_HOKUYO];
	double distances[MAX_SLITDIVISION_HOKUYO];
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&hokuyo, 0, sizeof(HOKUYO));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseHokuyo) 
		{
			if (bConnected)
			{
				printf("Hokuyo paused.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartHokuyo) 
		{
			if (bConnected)
			{
				printf("Restarting a Hokuyo.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
			}
			bRestartHokuyo = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectHokuyo(&hokuyo, "Hokuyo0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = hokuyo.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(angles, 0, sizeof(angles));
				memset(distances, 0, sizeof(distances));

				if (hokuyo.pfSaveFile != NULL)
				{
					fclose(hokuyo.pfSaveFile); 
					hokuyo.pfSaveFile = NULL;
				}
				if ((hokuyo.bSaveRawData)&&(hokuyo.pfSaveFile == NULL)) 
				{
					if (strlen(hokuyo.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", hokuyo.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "hokuyo");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					hokuyo.pfSaveFile = fopen(szSaveFilePath, "w");
					if (hokuyo.pfSaveFile == NULL) 
					{
						printf("Unable to create Hokuyo data file.\n");
						break;
					}
					fprintf(hokuyo.pfSaveFile, 
						"tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);...\n"
						); 
					fflush(hokuyo.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataHokuyo(&hokuyo, distances, angles) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				for (i = 0; i < hokuyo.StepCount; i++)
				{
					alpha_mes_hokuyo = angles[i];
					d_mes_hokuyo = distances[i];

					// For compatibility with a Seanet...
					d_all_mes_hokuyo.clear();
					d_all_mes_hokuyo.push_back(d_mes_hokuyo);

					alpha_mes_hokuyo_vector.push_back(alpha_mes_hokuyo);
					d_mes_hokuyo_vector.push_back(d_mes_hokuyo);
					d_all_mes_hokuyo_vector.push_back(d_all_mes_hokuyo);
					t_hokuyo_history_vector.push_back(tv.tv_sec+0.000001*tv.tv_usec);
					xhat_hokuyo_history_vector.push_back(xhat);
					yhat_hokuyo_history_vector.push_back(yhat);
					psihat_hokuyo_history_vector.push_back(psihat);
					vrxhat_hokuyo_history_vector.push_back(vrxhat);

					if ((int)alpha_mes_hokuyo_vector.size() > hokuyo.StepCount)
					{
						alpha_mes_hokuyo_vector.pop_front();
						d_mes_hokuyo_vector.pop_front();
						d_all_mes_hokuyo_vector.pop_front();
						t_hokuyo_history_vector.pop_front();
						xhat_hokuyo_history_vector.pop_front();
						yhat_hokuyo_history_vector.pop_front();
						psihat_hokuyo_history_vector.pop_front();
						vrxhat_hokuyo_history_vector.pop_front();
					}
				}

				LeaveCriticalSection(&StateVariablesCS);

				if (hokuyo.bSaveRawData)
				{
					//for (i = 0; i < hokuyo.StepCount; i++)
					//{
					//	fprintf(hokuyo.pfSaveFile, "%d;%d;%.3f;%.3f;\n", (int)tv.tv_sec, (int)tv.tv_usec, angles[i], distances[i]);
					//}
					fprintf(hokuyo.pfSaveFile, "%d;%d;", (int)tv.tv_sec, (int)tv.tv_usec);
					for (i = 0; i < hokuyo.StepCount; i++)
					{
						fprintf(hokuyo.pfSaveFile, "%.3f;%.3f;", angles[i], distances[i]);
					}
					fprintf(hokuyo.pfSaveFile, "\n");
					fflush(hokuyo.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a Hokuyo lost.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
				mSleep(threadperiod);
			}
		}

		//printf("HokuyoThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (hokuyo.pfSaveFile != NULL)
	{
		fclose(hokuyo.pfSaveFile); 
		hokuyo.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectHokuyo(&hokuyo);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}